

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.cpp
# Opt level: O0

Image * Test_Helper::uniformRGBImage(uint32_t width,uint32_t height,uint8_t value)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  uint32_t in_ESI;
  Image *in_RDI;
  uint32_t in_stack_ffffffffffffff98;
  Image *reference;
  uint8_t in_stack_ffffffffffffffb6;
  uint8_t in_stack_ffffffffffffffb7;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  Image local_40;
  
  reference = &local_40;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)(ulong)CONCAT14(in_CL,in_EDX),in_ESI,
             in_stack_ffffffffffffff98,(uint8_t)((ulong)in_RDI >> 0x38),
             (uint8_t)((ulong)in_RDI >> 0x30));
  anon_unknown.dwarf_a2ce3::generateImage
            (in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7,
             in_stack_ffffffffffffffb6,reference);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x16c405);
  return in_RDI;
}

Assistant:

PenguinV_Image::Image uniformRGBImage( uint32_t width, uint32_t height, uint8_t value )
    {
        return generateImage( width, height, PenguinV_Image::RGB, value);
    }